

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::BadNameString::~BadNameString(BadNameString *this)

{
  BadNameString *this_local;
  
  ~BadNameString(this);
  operator_delete(this);
  return;
}

Assistant:

static BadNameString OneCharName(std::string name) { return BadNameString("Invalid one char name: " + name); }